

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPUDPv6Transmitter::ClearAcceptIgnoreInfo(RTPUDPv6Transmitter *this)

{
  HashElement *pHVar1;
  HashElement *pHVar2;
  
  pHVar2 = (this->acceptignoreinfo).firsthashelem;
  (this->acceptignoreinfo).curhashelem = pHVar2;
  while (pHVar2 != (HashElement *)0x0) {
    RTPDelete<jrtplib::RTPUDPv6Transmitter::PortInfo>
              (pHVar2->element,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
    pHVar1 = (this->acceptignoreinfo).curhashelem;
    pHVar2 = (HashElement *)0x0;
    if (pHVar1 != (HashElement *)0x0) {
      pHVar2 = pHVar1->listnext;
      (this->acceptignoreinfo).curhashelem = pHVar2;
    }
  }
  RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
  ::Clear(&this->acceptignoreinfo);
  return;
}

Assistant:

void RTPUDPv6Transmitter::ClearAcceptIgnoreInfo()
{
	acceptignoreinfo.GotoFirstElement();
	while (acceptignoreinfo.HasCurrentElement())
	{
		PortInfo *inf;

		inf = acceptignoreinfo.GetCurrentElement();
		RTPDelete(inf,GetMemoryManager());
		acceptignoreinfo.GotoNextElement();
	}
	acceptignoreinfo.Clear();
}